

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2contains_point_query.h
# Opt level: O0

bool __thiscall
S2ContainsPointQuery<S2ShapeIndex>::VisitIncidentEdges
          (S2ContainsPointQuery<S2ShapeIndex> *this,S2Point *p,EdgeVisitor *visitor)

{
  S2ShapeIndex *pSVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  S2ShapeIndexCell *this_00;
  S2ClippedShape *this_01;
  undefined4 extraout_var;
  byte local_d1;
  ShapeEdge local_c0;
  undefined1 local_88 [8];
  Edge edge;
  int edge_id;
  int i;
  S2Shape *shape;
  int num_edges;
  S2ClippedShape *clipped;
  int s;
  int num_clipped;
  S2ShapeIndexCell *cell;
  EdgeVisitor *visitor_local;
  S2Point *p_local;
  S2ContainsPointQuery<S2ShapeIndex> *this_local;
  S2Shape *this_02;
  
  bVar2 = S2ShapeIndex::Iterator::Locate(&this->it_,p);
  if (bVar2) {
    this_00 = S2ShapeIndex::Iterator::cell(&this->it_);
    iVar3 = S2ShapeIndexCell::num_clipped(this_00);
    for (clipped._0_4_ = 0; (int)clipped < iVar3; clipped._0_4_ = (int)clipped + 1) {
      this_01 = S2ShapeIndexCell::clipped(this_00,(int)clipped);
      iVar4 = S2ClippedShape::num_edges(this_01);
      if (iVar4 != 0) {
        pSVar1 = this->index_;
        uVar5 = S2ClippedShape::shape_id(this_01);
        iVar6 = (*pSVar1->_vptr_S2ShapeIndex[3])(pSVar1,(ulong)uVar5);
        this_02 = (S2Shape *)CONCAT44(extraout_var,iVar6);
        for (edge.v1.c_[2]._4_4_ = 0; edge.v1.c_[2]._4_4_ < iVar4;
            edge.v1.c_[2]._4_4_ = edge.v1.c_[2]._4_4_ + 1) {
          edge.v1.c_[2]._0_4_ = S2ClippedShape::edge(this_01,edge.v1.c_[2]._4_4_);
          (*this_02->_vptr_S2Shape[3])(local_88,this_02,(ulong)edge.v1.c_[2]._0_4_);
          bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                            ((BasicVector<Vector3,_double,_3UL> *)local_88,p);
          if (bVar2) {
LAB_003b5169:
            iVar6 = S2Shape::id(this_02);
            s2shapeutil::ShapeEdge::ShapeEdge(&local_c0,iVar6,edge.v1.c_[2]._0_4_,(Edge *)local_88);
            bVar2 = std::function<bool_(const_s2shapeutil::ShapeEdge_&)>::operator()
                              (visitor,&local_c0);
            local_d1 = bVar2 ^ 0xff;
          }
          else {
            bVar2 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                              ((BasicVector<Vector3,_double,_3UL> *)(edge.v0.c_ + 2),p);
            local_d1 = 0;
            if (bVar2) goto LAB_003b5169;
          }
          if ((local_d1 & 1) != 0) {
            return false;
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool S2ContainsPointQuery<IndexType>::VisitIncidentEdges(
    const S2Point& p, const EdgeVisitor& visitor) {
  // This function returns "false" only if the algorithm terminates early
  // because the "visitor" function returned false.
  if (!it_.Locate(p)) return true;

  const S2ShapeIndexCell& cell = it_.cell();
  int num_clipped = cell.num_clipped();
  for (int s = 0; s < num_clipped; ++s) {
    const S2ClippedShape& clipped = cell.clipped(s);
    int num_edges = clipped.num_edges();
    if (num_edges == 0) continue;
    const S2Shape& shape = *index_->shape(clipped.shape_id());
    for (int i = 0; i < num_edges; ++i) {
      int edge_id = clipped.edge(i);
      auto edge = shape.edge(edge_id);
      if ((edge.v0 == p || edge.v1 == p) &&
          !visitor(s2shapeutil::ShapeEdge(shape.id(), edge_id, edge))) {
        return false;
      }
    }
  }
  return true;
}